

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O0

int Scl_LibertyComputeWorstCase
              (Vec_Ptr_t *vTables,Vec_Flt_t **pvInd0,Vec_Flt_t **pvInd1,Vec_Flt_t **pvValues)

{
  int iVar1;
  int iVar2;
  Vec_Flt_t *pVVar3;
  Vec_Flt_t *pVVar4;
  Vec_Flt_t *pVVar5;
  Vec_Flt_t *p1;
  Vec_Flt_t *p1_00;
  Vec_Flt_t *p;
  float Entry_00;
  float fVar6;
  float Entry;
  int nTriples;
  int k;
  int i;
  Vec_Flt_t *vvalues;
  Vec_Flt_t *vind1;
  Vec_Flt_t *vind0;
  Vec_Flt_t *vValues;
  Vec_Flt_t *vInd1;
  Vec_Flt_t *vInd0;
  Vec_Flt_t **pvValues_local;
  Vec_Flt_t **pvInd1_local;
  Vec_Flt_t **pvInd0_local;
  Vec_Ptr_t *vTables_local;
  
  iVar1 = Vec_PtrSize(vTables);
  iVar2 = Vec_PtrSize(vTables);
  if ((0 < iVar2) && (iVar2 = Vec_PtrSize(vTables), iVar2 % 3 == 0)) {
    if (iVar1 / 3 == 1) {
      pVVar3 = (Vec_Flt_t *)Vec_PtrEntry(vTables,0);
      *pvInd0 = pVVar3;
      pVVar3 = (Vec_Flt_t *)Vec_PtrEntry(vTables,1);
      *pvInd1 = pVVar3;
      pVVar3 = (Vec_Flt_t *)Vec_PtrEntry(vTables,2);
      *pvValues = pVVar3;
      Vec_PtrShrink(vTables,0);
    }
    else {
      pVVar3 = (Vec_Flt_t *)Vec_PtrEntry(vTables,0);
      pVVar3 = Vec_FltDup(pVVar3);
      pVVar4 = (Vec_Flt_t *)Vec_PtrEntry(vTables,1);
      pVVar4 = Vec_FltDup(pVVar4);
      pVVar5 = (Vec_Flt_t *)Vec_PtrEntry(vTables,2);
      pVVar5 = Vec_FltDup(pVVar5);
      for (nTriples = 1; nTriples < iVar1 / 3; nTriples = nTriples + 1) {
        p1 = (Vec_Flt_t *)Vec_PtrEntry(vTables,nTriples * 3);
        p1_00 = (Vec_Flt_t *)Vec_PtrEntry(vTables,nTriples * 3 + 1);
        p = (Vec_Flt_t *)Vec_PtrEntry(vTables,nTriples * 3 + 2);
        iVar2 = Vec_FltEqual(p1,pVVar3);
        if ((iVar2 != 0) && (iVar2 = Vec_FltEqual(p1_00,pVVar4), iVar2 != 0)) {
          for (Entry = 0.0; iVar2 = Vec_FltSize(p), (int)Entry < iVar2;
              Entry = (float)((int)Entry + 1)) {
            Entry_00 = Vec_FltEntry(p,(int)Entry);
            fVar6 = Vec_FltEntry(pVVar5,(int)Entry);
            if (fVar6 < Entry_00) {
              Vec_FltWriteEntry(pVVar5,(int)Entry,Entry_00);
            }
          }
        }
      }
      *pvInd0 = pVVar3;
      *pvInd1 = pVVar4;
      *pvValues = pVVar5;
    }
    return 1;
  }
  __assert_fail("Vec_PtrSize(vTables) > 0 && Vec_PtrSize(vTables) % 3 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLiberty.c"
                ,0x495,
                "int Scl_LibertyComputeWorstCase(Vec_Ptr_t *, Vec_Flt_t **, Vec_Flt_t **, Vec_Flt_t **)"
               );
}

Assistant:

int Scl_LibertyComputeWorstCase( Vec_Ptr_t * vTables, Vec_Flt_t ** pvInd0, Vec_Flt_t ** pvInd1, Vec_Flt_t ** pvValues )
{
    Vec_Flt_t * vInd0, * vInd1, * vValues;
    Vec_Flt_t * vind0, * vind1, * vvalues;
    int i, k, nTriples = Vec_PtrSize(vTables) / 3;
    float Entry;
    assert( Vec_PtrSize(vTables) > 0 && Vec_PtrSize(vTables) % 3 == 0 );
    if ( nTriples == 1 )
    {
        *pvInd0   = (Vec_Flt_t *)Vec_PtrEntry(vTables, 0);
        *pvInd1   = (Vec_Flt_t *)Vec_PtrEntry(vTables, 1);
        *pvValues = (Vec_Flt_t *)Vec_PtrEntry(vTables, 2);
        Vec_PtrShrink( vTables, 0 );
        return 1;
    }
    vInd0   = Vec_FltDup( (Vec_Flt_t *)Vec_PtrEntry(vTables, 0) );
    vInd1   = Vec_FltDup( (Vec_Flt_t *)Vec_PtrEntry(vTables, 1) );
    vValues = Vec_FltDup( (Vec_Flt_t *)Vec_PtrEntry(vTables, 2) );
    for ( i = 1; i < nTriples; i++ )
    {
        vind0   = (Vec_Flt_t *)Vec_PtrEntry(vTables, i*3+0);
        vind1   = (Vec_Flt_t *)Vec_PtrEntry(vTables, i*3+1);
        vvalues = (Vec_Flt_t *)Vec_PtrEntry(vTables, i*3+2);
        // check equality of indexes
        if ( !Vec_FltEqual(vind0, vInd0) )
            continue;//return 0;
        if ( !Vec_FltEqual(vind1, vInd1) )
            continue;//return 0;
//        Vec_FltForEachEntry( vvalues, Entry, k )
//            Vec_FltAddToEntry( vValues, k, Entry );
        Vec_FltForEachEntry( vvalues, Entry, k )
            if ( Vec_FltEntry(vValues, k) < Entry )
                Vec_FltWriteEntry( vValues, k, Entry );
    }
//    Vec_FltForEachEntry( vValues, Entry, k )
//        Vec_FltWriteEntry( vValues, k, Entry/nTriples );
    // return the result
    *pvInd0 = vInd0;
    *pvInd1 = vInd1;
    *pvValues = vValues;
    return 1;
}